

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O1

void g2d_line_init_from_points(g2d_line_t *line,double *p0,double *p1)

{
  float fVar1;
  double dVar2;
  double dVar3;
  
  line->p[0] = *p0;
  line->p[1] = p0[1];
  dVar2 = *p1 - *p0;
  line->u[0] = dVar2;
  dVar3 = p1[1] - p0[1];
  line->u[1] = dVar3;
  fVar1 = (float)(dVar3 * dVar3 + dVar2 * dVar2);
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  dVar2 = line->u[1];
  line->u[0] = line->u[0] / (double)fVar1;
  line->u[1] = dVar2 / (double)fVar1;
  return;
}

Assistant:

void g2d_line_init_from_points(g2d_line_t *line, const double p0[2], const double p1[2])
{
    line->p[0] = p0[0];
    line->p[1] = p0[1];
    line->u[0] = p1[0]-p0[0];
    line->u[1] = p1[1]-p0[1];
    double mag = sqrtf(sq(line->u[0]) + sq(line->u[1]));

    line->u[0] /= mag;
    line->u[1] /= mag;
}